

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::FixedCol::undo
          (FixedCol *this,HighsOptions *options,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *colValues,HighsSolution *solution,HighsBasis *basis)

{
  HighsBasisStatus HVar1;
  int iVar2;
  pointer pNVar3;
  pointer pdVar4;
  pointer pHVar5;
  pointer pNVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar2 = this->col;
  (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar2] = this->fixValue;
  if (solution->dual_valid == true) {
    dVar10 = this->colCost;
    pNVar6 = (colValues->
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pNVar3 = (colValues->
             super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar6 == pNVar3) {
      dVar8 = 0.0;
    }
    else {
      pdVar4 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar8 = 0.0;
      dVar7 = dVar10;
      do {
        dVar10 = dVar7;
        if ((ulong)(long)pNVar6->index <
            (ulong)((long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
          dVar9 = pNVar6->value * pdVar4[pNVar6->index];
          dVar10 = dVar7 - dVar9;
          dVar8 = dVar8 + (dVar7 - (dVar9 + dVar10)) + (-dVar9 - (dVar10 - (dVar9 + dVar10)));
        }
        pNVar6 = pNVar6 + 1;
        dVar7 = dVar10;
      } while (pNVar6 != pNVar3);
    }
    (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = dVar10 + dVar8;
    if (basis->valid != false) {
      HVar1 = this->fixType;
      pHVar5 = (basis->col_status).
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      pHVar5[iVar2] = HVar1;
      if (HVar1 == kNonbasic) {
        pHVar5[iVar2] = (dVar10 + dVar8 < 0.0) * '\x02';
      }
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::FixedCol::undo(const HighsOptions& options,
                                         const std::vector<Nonzero>& colValues,
                                         HighsSolution& solution,
                                         HighsBasis& basis) const {
  // set solution value
  solution.col_value[col] = fixValue;

  if (!solution.dual_valid) return;

  // compute reduced cost

  HighsCDouble reducedCost = colCost;
  for (const auto& colVal : colValues) {
    if (static_cast<size_t>(colVal.index) < solution.row_dual.size())
      reducedCost -= colVal.value * solution.row_dual[colVal.index];
  }

  solution.col_dual[col] = double(reducedCost);

  // set basis status
  if (basis.valid) {
    basis.col_status[col] = fixType;
    if (basis.col_status[col] == HighsBasisStatus::kNonbasic)
      basis.col_status[col] = solution.col_dual[col] >= 0
                                  ? HighsBasisStatus::kLower
                                  : HighsBasisStatus::kUpper;
  }
}